

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::EscapeForShell_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view str,bool makeVars,
          bool forEcho,bool useWatcomQuote,bool unescapeNinjaConfiguration,bool forResponse)

{
  cmStateSnapshot *this_00;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  cmState *pcVar4;
  undefined3 in_register_00000081;
  int flags;
  undefined3 in_register_00000089;
  string_view str_00;
  
  this_00 = &this->StateSnapshot;
  flags = CONCAT31(in_register_00000081,makeVars);
  pcVar4 = cmStateSnapshot::GetState(this_00);
  bVar2 = cmState::UseWindowsVSIDE(pcVar4);
  uVar3 = 2;
  if (!bVar2) {
    uVar3 = this->LinkScriptShell ^ 1;
  }
  uVar1 = uVar3 + 0x200;
  if (!unescapeNinjaConfiguration) {
    uVar1 = uVar3;
  }
  uVar3 = uVar1 | 0x40;
  if (CONCAT31(in_register_00000081,makeVars) == 0) {
    uVar3 = uVar1;
  }
  uVar1 = uVar3 | 4;
  if (CONCAT31(in_register_00000089,forEcho) == 0) {
    uVar1 = uVar3;
  }
  uVar3 = uVar1 | 0x80;
  if (!useWatcomQuote) {
    uVar3 = uVar1;
  }
  uVar1 = uVar3 | 0x400;
  if (!forResponse) {
    uVar1 = uVar3;
  }
  pcVar4 = cmStateSnapshot::GetState(this_00);
  bVar2 = cmState::UseWatcomWMake(pcVar4);
  uVar3 = uVar1 | 8;
  if (!bVar2) {
    uVar3 = uVar1;
  }
  pcVar4 = cmStateSnapshot::GetState(this_00);
  bVar2 = cmState::UseMinGWMake(pcVar4);
  uVar1 = uVar3 | 0x10;
  if (!bVar2) {
    uVar1 = uVar3;
  }
  pcVar4 = cmStateSnapshot::GetState(this_00);
  bVar2 = cmState::UseNMake(pcVar4);
  uVar3 = uVar1 | 0x20;
  if (!bVar2) {
    uVar3 = uVar1;
  }
  pcVar4 = cmStateSnapshot::GetState(this_00);
  bVar2 = cmState::UseNinja(pcVar4);
  uVar1 = uVar3 | 0x800;
  if (!bVar2) {
    uVar1 = uVar3;
  }
  pcVar4 = cmStateSnapshot::GetState(this_00);
  bVar2 = cmState::UseWindowsShell(pcVar4);
  uVar3 = uVar1 | 0x100;
  if (bVar2) {
    uVar3 = uVar1;
  }
  str_00._M_str._0_4_ = uVar3;
  str_00._M_len = (size_t)str._M_str;
  str_00._M_str._4_4_ = 0;
  EscapeForShell_abi_cxx11_(__return_storage_ptr__,(cmOutputConverter *)str._M_len,str_00,flags);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForShell(cm::string_view str,
                                              bool makeVars, bool forEcho,
                                              bool useWatcomQuote,
                                              bool unescapeNinjaConfiguration,
                                              bool forResponse) const
{
  // Compute the flags for the target shell environment.
  int flags = 0;
  if (this->GetState()->UseWindowsVSIDE()) {
    flags |= Shell_Flag_VSIDE;
  } else if (!this->LinkScriptShell) {
    flags |= Shell_Flag_Make;
  }
  if (unescapeNinjaConfiguration) {
    flags |= Shell_Flag_UnescapeNinjaConfiguration;
  }
  if (makeVars) {
    flags |= Shell_Flag_AllowMakeVariables;
  }
  if (forEcho) {
    flags |= Shell_Flag_EchoWindows;
  }
  if (useWatcomQuote) {
    flags |= Shell_Flag_WatcomQuote;
  }
  if (forResponse) {
    flags |= Shell_Flag_IsResponse;
  }
  if (this->GetState()->UseWatcomWMake()) {
    flags |= Shell_Flag_WatcomWMake;
  }
  if (this->GetState()->UseMinGWMake()) {
    flags |= Shell_Flag_MinGWMake;
  }
  if (this->GetState()->UseNMake()) {
    flags |= Shell_Flag_NMake;
  }
  if (this->GetState()->UseNinja()) {
    flags |= Shell_Flag_Ninja;
  }
  if (!this->GetState()->UseWindowsShell()) {
    flags |= Shell_Flag_IsUnix;
  }

  return cmOutputConverter::EscapeForShell(str, flags);
}